

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSkinMeshBuffer.h
# Opt level: O0

void * __thiscall irr::scene::SSkinMeshBuffer::getVertices(SSkinMeshBuffer *this)

{
  int iVar1;
  array<irr::video::S3DVertex> *in_RDI;
  S3DVertexTangents *local_8;
  
  iVar1 = *(int *)&in_RDI[0xc].m_data.
                   super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1 == 1) {
    local_8 = (S3DVertexTangents *)
              core::array<irr::video::S3DVertex2TCoords>::const_pointer
                        ((array<irr::video::S3DVertex2TCoords> *)in_RDI);
  }
  else if (iVar1 == 2) {
    local_8 = core::array<irr::video::S3DVertexTangents>::const_pointer
                        ((array<irr::video::S3DVertexTangents> *)in_RDI);
  }
  else {
    local_8 = (S3DVertexTangents *)core::array<irr::video::S3DVertex>::const_pointer(in_RDI);
  }
  return local_8;
}

Assistant:

const void *getVertices() const override
	{
		switch (VertexType) {
		case video::EVT_2TCOORDS:
			return Vertices_2TCoords.const_pointer();
		case video::EVT_TANGENTS:
			return Vertices_Tangents.const_pointer();
		default:
			return Vertices_Standard.const_pointer();
		}
	}